

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  int iVar1;
  int i;
  
  if (pParse->nColCache != '\0') {
    i = 0;
    do {
      iVar1 = pParse->aColCache[i].iReg;
      if (iVar1 < nReg + iReg && iReg <= iVar1) {
        cacheEntryClear(pParse,i);
      }
      else {
        i = i + 1;
      }
    } while (i < (int)(uint)pParse->nColCache);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i = 0;
  while( i<pParse->nColCache ){
    struct yColCache *p = &pParse->aColCache[i];
    if( p->iReg >= iReg && p->iReg < iReg+nReg ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}